

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithComponentGradients2D(PixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  Vec4 *this;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_4> local_50;
  float local_40;
  float local_3c;
  float a;
  float b;
  float g;
  float r;
  float t;
  float s;
  int x;
  int y;
  Vec4 *maxVal_local;
  Vec4 *minVal_local;
  PixelBufferAccess *access_local;
  
  s = 0.0;
  _x = maxVal;
  maxVal_local = minVal;
  minVal_local = (Vec4 *)access;
  while( true ) {
    fVar2 = s;
    iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)minVal_local);
    if (iVar1 <= (int)fVar2) break;
    t = 0.0;
    while( true ) {
      fVar2 = t;
      iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local);
      if (iVar1 <= (int)fVar2) break;
      fVar2 = (float)(int)t;
      iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local);
      r = (fVar2 + 0.5) / (float)iVar1;
      fVar2 = (float)(int)s;
      iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)minVal_local);
      g = (fVar2 + 0.5) / (float)iVar1;
      fVar2 = r + g;
      fVar3 = Vector<float,_4>::x(maxVal_local);
      fVar4 = Vector<float,_4>::x(_x);
      b = linearInterpolate(fVar2 * 0.5,fVar3,fVar4);
      fVar2 = r + (1.0 - g);
      fVar3 = Vector<float,_4>::y(maxVal_local);
      fVar4 = Vector<float,_4>::y(_x);
      a = linearInterpolate(fVar2 * 0.5,fVar3,fVar4);
      fVar2 = (1.0 - r) + g;
      fVar3 = Vector<float,_4>::z(maxVal_local);
      fVar4 = Vector<float,_4>::z(_x);
      local_3c = linearInterpolate(fVar2 * 0.5,fVar3,fVar4);
      fVar2 = 1.0 - r;
      fVar5 = 1.0 - g;
      fVar3 = Vector<float,_4>::w(maxVal_local);
      fVar4 = Vector<float,_4>::w(_x);
      local_40 = linearInterpolate((fVar2 + fVar5) * 0.5,fVar3,fVar4);
      this = minVal_local;
      Vector<float,_4>::Vector(&local_50,b,a,local_3c,local_40);
      PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_50,(int)t,(int)s,0);
      t = (float)((int)t + 1);
    }
    s = (float)((int)s + 1);
  }
  return;
}

Assistant:

static void fillWithComponentGradients2D (const PixelBufferAccess& access, const Vec4& minVal, const Vec4& maxVal)
{
	for (int y = 0; y < access.getHeight(); y++)
	{
		for (int x = 0; x < access.getWidth(); x++)
		{
			float s = ((float)x + 0.5f) / (float)access.getWidth();
			float t = ((float)y + 0.5f) / (float)access.getHeight();

			float r = linearInterpolate((      s  +       t) *0.5f, minVal.x(), maxVal.x());
			float g = linearInterpolate((      s  + (1.0f-t))*0.5f, minVal.y(), maxVal.y());
			float b = linearInterpolate(((1.0f-s) +       t) *0.5f, minVal.z(), maxVal.z());
			float a = linearInterpolate(((1.0f-s) + (1.0f-t))*0.5f, minVal.w(), maxVal.w());

			access.setPixel(tcu::Vec4(r, g, b, a), x, y);
		}
	}
}